

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::ProcessHorizontal(Clipper *this,TEdge *horzEdge)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  bool bVar3;
  clipperException *pcVar4;
  IntersectProtects IVar5;
  IntPoint local_d8;
  IntPoint local_c8;
  IntPoint local_b8;
  IntPoint local_a8;
  IntPoint local_98;
  IntPoint local_88 [2];
  IntPoint local_68;
  IntPoint local_58;
  TEdge *local_48;
  TEdge *eNext;
  TEdge *e;
  TEdge *eMaxPair;
  long64 horzRight;
  long64 horzLeft;
  TEdge *pTStack_18;
  Direction dir;
  TEdge *horzEdge_local;
  Clipper *this_local;
  
  bVar3 = horzEdge->xtop <= horzEdge->xcurr;
  if (bVar3) {
    horzRight = horzEdge->xtop;
    eMaxPair = (TEdge *)horzEdge->xcurr;
  }
  else {
    horzRight = horzEdge->xcurr;
    eMaxPair = (TEdge *)horzEdge->xtop;
  }
  horzLeft._4_4_ = (Direction)!bVar3;
  pTStack_18 = horzEdge;
  horzEdge_local = (TEdge *)this;
  if (horzEdge->nextInLML == (TEdge *)0x0) {
    e = GetMaximaPair(horzEdge);
  }
  else {
    e = (TEdge *)0x0;
  }
  eNext = GetNextInAEL(pTStack_18,horzLeft._4_4_);
  do {
    if (eNext == (TEdge *)0x0) {
LAB_00ad7762:
      pTVar2 = pTStack_18;
      pTVar1 = e;
      if (pTStack_18->nextInLML == (TEdge *)0x0) {
        if (-1 < pTStack_18->outIdx) {
          IntPoint::IntPoint(&local_d8,pTStack_18->xtop,pTStack_18->ycurr);
          IntersectEdges(this,pTVar2,pTVar1,&local_d8,ipBoth);
        }
        if (e == (TEdge *)0x0) {
          __assert_fail("eMaxPair",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/clipper/clipper.cpp"
                        ,0x988,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
        }
        if (-1 < e->outIdx) {
          pcVar4 = (clipperException *)__cxa_allocate_exception(0x28);
          clipperException::clipperException(pcVar4,"ProcessHorizontal error");
          __cxa_throw(pcVar4,&clipperException::typeinfo,clipperException::~clipperException);
        }
        DeleteFromAEL(this,e);
        DeleteFromAEL(this,pTStack_18);
      }
      else {
        if (-1 < pTStack_18->outIdx) {
          IntPoint::IntPoint(&local_c8,pTStack_18->xtop,pTStack_18->ytop);
          AddOutPt(this,pTVar2,&local_c8);
        }
        UpdateEdgeIntoAEL(this,&stack0xffffffffffffffe8);
      }
      return;
    }
    local_48 = GetNextInAEL(eNext,horzLeft._4_4_);
    if (((e == (TEdge *)0x0) &&
        ((horzLeft._4_4_ != dLeftToRight || ((long)eMaxPair < eNext->xcurr)))) &&
       ((horzLeft._4_4_ != dRightToLeft || (eNext->xcurr < horzRight)))) {
      if ((((horzLeft._4_4_ == dLeftToRight) && ((long)eMaxPair < eNext->xcurr)) &&
          (this->m_SortedEdges != (TEdge *)0x0)) ||
         (((horzLeft._4_4_ == dRightToLeft && (eNext->xcurr < horzRight)) &&
          (this->m_SortedEdges != (TEdge *)0x0)))) goto LAB_00ad7762;
    }
    else {
      if ((eNext->xcurr == pTStack_18->xtop) && (e == (TEdge *)0x0)) {
        if (pTStack_18->nextInLML == (TEdge *)0x0) {
          __assert_fail("horzEdge->nextInLML",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/contrib/clipper/clipper.cpp"
                        ,0x947,"void ClipperLib::Clipper::ProcessHorizontal(TEdge *)");
        }
        bVar3 = SlopesEqual(eNext,pTStack_18->nextInLML,
                            (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                         [(long)&(this->m_PolyOuts).
                                                 super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                         ] & 1));
        if (bVar3) {
          if ((-1 < pTStack_18->outIdx) && (-1 < eNext->outIdx)) {
            AddJoin(this,pTStack_18->nextInLML,eNext,pTStack_18->outIdx,-1);
          }
          goto LAB_00ad7762;
        }
        if (eNext->dx < pTStack_18->nextInLML->dx) goto LAB_00ad7762;
      }
      pTVar2 = pTStack_18;
      pTVar1 = eNext;
      if (eNext == e) {
        if (horzLeft._4_4_ == dLeftToRight) {
          IntPoint::IntPoint(&local_58,eNext->xcurr,pTStack_18->ycurr);
          IntersectEdges(this,pTVar2,pTVar1,&local_58,ipNone);
        }
        else {
          IntPoint::IntPoint(&local_68,eNext->xcurr,pTStack_18->ycurr);
          IntersectEdges(this,pTVar1,pTVar2,&local_68,ipNone);
        }
        if (e->outIdx < 0) {
          return;
        }
        pcVar4 = (clipperException *)__cxa_allocate_exception(0x28);
        clipperException::clipperException(pcVar4,"ProcessHorizontal error");
        __cxa_throw(pcVar4,&clipperException::typeinfo,clipperException::~clipperException);
      }
      if ((((eNext->dx - -1e+40 <= -1e-20) || (1e-20 <= eNext->dx - -1e+40)) ||
          (bVar3 = IsMinima(eNext), pTVar2 = pTStack_18, pTVar1 = eNext, bVar3)) ||
         (eNext->xtop < eNext->xcurr)) {
        pTVar2 = pTStack_18;
        pTVar1 = eNext;
        if (horzLeft._4_4_ == dLeftToRight) {
          IntPoint::IntPoint(&local_a8,eNext->xcurr,pTStack_18->ycurr);
          bVar3 = IsTopHorz(this,eNext->xcurr);
          IVar5 = ipBoth;
          if (bVar3) {
            IVar5 = ipLeft;
          }
          IntersectEdges(this,pTVar2,pTVar1,&local_a8,IVar5);
        }
        else {
          IntPoint::IntPoint(&local_b8,eNext->xcurr,pTStack_18->ycurr);
          bVar3 = IsTopHorz(this,eNext->xcurr);
          IVar5 = ipBoth;
          if (bVar3) {
            IVar5 = ipRight;
          }
          IntersectEdges(this,pTVar1,pTVar2,&local_b8,IVar5);
        }
      }
      else if (horzLeft._4_4_ == dLeftToRight) {
        IntPoint::IntPoint(local_88,eNext->xcurr,pTStack_18->ycurr);
        bVar3 = IsTopHorz(this,eNext->xcurr);
        IVar5 = ipBoth;
        if (bVar3) {
          IVar5 = ipLeft;
        }
        IntersectEdges(this,pTVar2,pTVar1,local_88,IVar5);
      }
      else {
        IntPoint::IntPoint(&local_98,eNext->xcurr,pTStack_18->ycurr);
        bVar3 = IsTopHorz(this,eNext->xcurr);
        IVar5 = ipBoth;
        if (bVar3) {
          IVar5 = ipRight;
        }
        IntersectEdges(this,pTVar1,pTVar2,&local_98,IVar5);
      }
      SwapPositionsInAEL(this,pTStack_18,eNext);
    }
    eNext = local_48;
  } while( true );
}

Assistant:

void Clipper::ProcessHorizontal(TEdge *horzEdge)
{
  Direction dir;
  long64 horzLeft, horzRight;

  if( horzEdge->xcurr < horzEdge->xtop )
  {
    horzLeft = horzEdge->xcurr;
    horzRight = horzEdge->xtop;
    dir = dLeftToRight;
  } else
  {
    horzLeft = horzEdge->xtop;
    horzRight = horzEdge->xcurr;
    dir = dRightToLeft;
  }

  TEdge* eMaxPair;
  if( horzEdge->nextInLML ) eMaxPair = 0;
  else eMaxPair = GetMaximaPair(horzEdge);

  TEdge* e = GetNextInAEL( horzEdge , dir );
  while( e )
  {
    TEdge* eNext = GetNextInAEL( e, dir );

    if (eMaxPair ||
      ((dir == dLeftToRight) && (e->xcurr <= horzRight)) ||
      ((dir == dRightToLeft) && (e->xcurr >= horzLeft)))
    {
      //ok, so far it looks like we're still in range of the horizontal edge
      if ( e->xcurr == horzEdge->xtop && !eMaxPair )
      {
        assert(horzEdge->nextInLML);
        if (SlopesEqual(*e, *horzEdge->nextInLML, m_UseFullRange))
        {
          //if output polygons share an edge, they'll need joining later ...
          if (horzEdge->outIdx >= 0 && e->outIdx >= 0)
            AddJoin(horzEdge->nextInLML, e, horzEdge->outIdx);
          break; //we've reached the end of the horizontal line
        }
        else if (e->dx < horzEdge->nextInLML->dx)
        //we really have got to the end of the intermediate horz edge so quit.
        //nb: More -ve slopes follow more +ve slopes ABOVE the horizontal.
          break;
      }

      if( e == eMaxPair )
      {
        //horzEdge is evidently a maxima horizontal and we've arrived at its end.
        if (dir == dLeftToRight)
          IntersectEdges(horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        else
          IntersectEdges(e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr), ipNone);
        if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
        return;
      }
      else if( NEAR_EQUAL(e->dx, HORIZONTAL) &&  !IsMinima(e) && !(e->xcurr > e->xtop) )
      {
        //An overlapping horizontal edge. Overlapping horizontal edges are
        //processed as if layered with the current horizontal edge (horizEdge)
        //being infinitesimally lower that the next (e). Therfore, we
        //intersect with e only if e.xcurr is within the bounds of horzEdge ...
        if( dir == dLeftToRight )
          IntersectEdges( horzEdge , e, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
        else
          IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
            (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      else if( dir == dLeftToRight )
      {
        IntersectEdges( horzEdge, e, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipLeft : ipBoth );
      }
      else
      {
        IntersectEdges( e, horzEdge, IntPoint(e->xcurr, horzEdge->ycurr),
          (IsTopHorz( e->xcurr ))? ipRight : ipBoth );
      }
      SwapPositionsInAEL( horzEdge, e );
    }
    else if( (dir == dLeftToRight && e->xcurr > horzRight  && m_SortedEdges) ||
     (dir == dRightToLeft && e->xcurr < horzLeft && m_SortedEdges) ) break;
    e = eNext;
  } //end while

  if( horzEdge->nextInLML )
  {
    if( horzEdge->outIdx >= 0 )
      AddOutPt( horzEdge, IntPoint(horzEdge->xtop, horzEdge->ytop));
    UpdateEdgeIntoAEL( horzEdge );
  }
  else
  {
    if ( horzEdge->outIdx >= 0 )
      IntersectEdges( horzEdge, eMaxPair,
      IntPoint(horzEdge->xtop, horzEdge->ycurr), ipBoth);
    assert(eMaxPair);
    if (eMaxPair->outIdx >= 0) throw clipperException("ProcessHorizontal error");
    DeleteFromAEL(eMaxPair);
    DeleteFromAEL(horzEdge);
  }
}